

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::FillInlineesDataArrayUsingFixedMethods
          (Inline *this,FunctionJITTimeInfo *inlineeJitTimeData,
          FunctionJITTimeInfo **inlineesDataArray,uint inlineesDataArrayLength,
          FixedFieldInfo *fixedFieldInfoArray,uint16 cachedFixedInlineeCount)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  intptr_t iVar6;
  FunctionJITTimeInfo *pFVar7;
  intptr_t iVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  ushort local_4a;
  uint16 i;
  FunctionJITTimeInfo *jitTimeData;
  JITTimeFunctionBody *inlineeFuncBody;
  uint16 cachedFixedInlineeCount_local;
  FixedFieldInfo *fixedFieldInfoArray_local;
  uint inlineesDataArrayLength_local;
  FunctionJITTimeInfo **inlineesDataArray_local;
  FunctionJITTimeInfo *inlineeJitTimeData_local;
  Inline *this_local;
  
  inlineesDataArray_local = (FunctionJITTimeInfo **)inlineeJitTimeData;
  if (inlineesDataArrayLength < cachedFixedInlineeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x2aa,"(cachedFixedInlineeCount <= inlineesDataArrayLength)",
                       "cachedFixedInlineeCount <= inlineesDataArrayLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  do {
    if (inlineesDataArray_local == (FunctionJITTimeInfo **)0x0) {
      return;
    }
    bVar2 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)inlineesDataArray_local);
    if (bVar2) {
      this_00 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)inlineesDataArray_local);
      uVar3 = FunctionJITTimeInfo::GetSourceContextId
                        ((FunctionJITTimeInfo *)inlineesDataArray_local);
      uVar4 = FunctionJITTimeInfo::GetLocalFunctionId
                        ((FunctionJITTimeInfo *)inlineesDataArray_local);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,PolymorphicInlinePhase,uVar3,uVar4);
      if (!bVar2) {
        uVar3 = FunctionJITTimeInfo::GetSourceContextId
                          ((FunctionJITTimeInfo *)inlineesDataArray_local);
        uVar4 = FunctionJITTimeInfo::GetLocalFunctionId
                          ((FunctionJITTimeInfo *)inlineesDataArray_local);
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01eafdf0,PolymorphicInlineFixedMethodsPhase,uVar3,uVar4);
        if (!bVar2) {
          iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr
                            ((FunctionJITTimeInfo *)inlineesDataArray_local);
          pFVar7 = FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr
                             ((FunctionJITTimeInfo *)inlineesDataArray_local,iVar6);
          if (pFVar7 == (FunctionJITTimeInfo *)0x0) {
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
            if (bVar2) {
              pcVar9 = JITTimeFunctionBody::GetDisplayName(this_00);
              pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet
                                  ((FunctionJITTimeInfo *)inlineesDataArray_local,
                                   (wchar (*) [42])local_a8);
              Output::Print(L"INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"
                            ,pcVar9,pcVar10);
              Output::Flush();
            }
          }
          else {
            for (local_4a = 0; local_4a < cachedFixedInlineeCount; local_4a = local_4a + 1) {
              iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr
                                ((FunctionJITTimeInfo *)inlineesDataArray_local);
              iVar8 = FixedFieldInfo::GetFuncInfoAddr(fixedFieldInfoArray + local_4a);
              if (iVar6 == iVar8) {
                iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr
                                  ((FunctionJITTimeInfo *)inlineesDataArray_local);
                pFVar7 = FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr
                                   ((FunctionJITTimeInfo *)inlineesDataArray_local,iVar6);
                inlineesDataArray[local_4a] = pFVar7;
                break;
              }
            }
          }
        }
      }
    }
    inlineesDataArray_local =
         (FunctionJITTimeInfo **)
         FunctionJITTimeInfo::GetNext((FunctionJITTimeInfo *)inlineesDataArray_local);
  } while( true );
}

Assistant:

void Inline::FillInlineesDataArrayUsingFixedMethods(
    const FunctionJITTimeInfo* inlineeJitTimeData,
        __inout_ecount(inlineesDataArrayLength) const FunctionJITTimeInfo ** inlineesDataArray,
        uint inlineesDataArrayLength,
        __inout_ecount(cachedFixedInlineeCount) FixedFieldInfo* fixedFieldInfoArray,
        uint16 cachedFixedInlineeCount
        )
{
    AnalysisAssert(cachedFixedInlineeCount <= inlineesDataArrayLength);

    JITTimeFunctionBody* inlineeFuncBody = nullptr;
    while (inlineeJitTimeData)
    {
        if (inlineeJitTimeData->HasBody())
        {
             inlineeFuncBody = inlineeJitTimeData->GetBody();
            if (!PHASE_OFF(Js::PolymorphicInlinePhase, inlineeJitTimeData) && !PHASE_OFF(Js::PolymorphicInlineFixedMethodsPhase, inlineeJitTimeData))
            {
                const FunctionJITTimeInfo * jitTimeData = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeJitTimeData->GetFunctionInfoAddr());
                if (jitTimeData)
                {
                    for (uint16 i = 0; i < cachedFixedInlineeCount; i++)
                    {
                        if (inlineeJitTimeData->GetFunctionInfoAddr() == fixedFieldInfoArray[i].GetFuncInfoAddr())
                        {
                            inlineesDataArray[i] = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeJitTimeData->GetFunctionInfoAddr());
                            break;
                        }
                    }
                }
                else
                {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                    POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"),
                                inlineeFuncBody->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer));
                }
            }
        }
        inlineeJitTimeData = inlineeJitTimeData->GetNext();
    }
}